

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O2

Statement *
slang::ast::Statement::bindBlock
          (StatementBlockSymbol *block,SyntaxNode *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  SyntaxKind SVar1;
  StatementKind SVar2;
  Compilation *comp;
  SyntaxNode *pSVar3;
  SyntaxNode *pSVar4;
  SyntaxKind *pSVar5;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar6;
  int iVar7;
  Statement *stmt;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  BlockStatement *stmt_00;
  bool bVar8;
  StatementSyntax *pSVar9;
  BlockStatement *ctx;
  SmallVector<const_slang::ast::Statement_*,_5UL> *buffer_00;
  long lVar10;
  Statement *local_88;
  SyntaxNode *local_80;
  StatementBlockSymbol *local_78;
  SmallVector<const_slang::ast::Statement_*,_5UL> buffer;
  
  comp = ((context->scope).ptr)->compilation;
  SVar1 = syntax->kind;
  if (SVar1 == SequentialBlockStatement) {
LAB_002276df:
    stmt = BlockStatement::fromSyntax(comp,(BlockStatementSyntax *)syntax,context,stmtCtx,true);
    if (stmt->kind != Invalid) {
      stmt->syntax = (StatementSyntax *)syntax;
      ASTContext::setAttributes
                (context,stmt,
                 *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                   *)(syntax + 3));
      stmt[1].syntax = (StatementSyntax *)block;
    }
  }
  else {
    if (SVar1 == RsCodeBlock) {
      buffer.super_SmallVectorBase<const_slang::ast::Statement_*>.data_ =
           (pointer)buffer.super_SmallVectorBase<const_slang::ast::Statement_*>.firstElement;
      buffer.super_SmallVectorBase<const_slang::ast::Statement_*>.len = 0;
      buffer.super_SmallVectorBase<const_slang::ast::Statement_*>.cap = 5;
      local_78 = block;
      bindScopeInitializers(context,&buffer.super_SmallVectorBase<const_slang::ast::Statement_*>);
      pSVar3 = syntax[3].parent;
      pSVar4 = syntax[3].previewNode;
      bVar8 = false;
      local_80 = syntax;
      for (lVar10 = 0; (long)pSVar4 << 3 != lVar10; lVar10 = lVar10 + 8) {
        pSVar5 = *(SyntaxKind **)((long)&pSVar3->kind + lVar10);
        bVar6 = slang::syntax::StatementSyntax::isKind(*pSVar5);
        if (bVar6) {
          iVar7 = bind((int)pSVar5,(sockaddr *)context,(socklen_t)stmtCtx);
          local_88 = (Statement *)CONCAT44(extraout_var,iVar7);
          SmallVectorBase<slang::ast::Statement_const*>::emplace_back<slang::ast::Statement_const*>
                    ((SmallVectorBase<slang::ast::Statement_const*> *)&buffer,&local_88);
          bVar8 = (bool)(bVar8 | ((Statement *)CONCAT44(extraout_var,iVar7))->kind == Invalid);
        }
      }
      buffer_00 = &buffer;
      stmt_00 = createBlockStatement
                          (comp,&buffer_00->super_SmallVectorBase<const_slang::ast::Statement_*>,
                           local_80,Sequential);
      SmallVectorBase<const_slang::ast::Statement_*>::cleanup
                (&buffer.super_SmallVectorBase<const_slang::ast::Statement_*>,
                 (EVP_PKEY_CTX *)buffer_00);
      stmt_00->blockSymbol = local_78;
      if (!bVar8) {
        return &stmt_00->super_Statement;
      }
    }
    else {
      if (SVar1 == ParallelBlockStatement) goto LAB_002276df;
      buffer.super_SmallVectorBase<const_slang::ast::Statement_*>.data_ =
           (pointer)buffer.super_SmallVectorBase<const_slang::ast::Statement_*>.firstElement;
      buffer.super_SmallVectorBase<const_slang::ast::Statement_*>.len = 0;
      buffer.super_SmallVectorBase<const_slang::ast::Statement_*>.cap = 5;
      bindScopeInitializers(context,&buffer.super_SmallVectorBase<const_slang::ast::Statement_*>);
      pSVar9 = (StatementSyntax *)syntax;
      if (syntax->kind == PatternCaseItem) {
        pSVar9 = *(StatementSyntax **)(syntax + 3);
      }
      iVar7 = bind((int)pSVar9,(sockaddr *)context,(socklen_t)stmtCtx);
      local_88 = (Statement *)CONCAT44(extraout_var_00,iVar7);
      SmallVectorBase<slang::ast::Statement_const*>::emplace_back<slang::ast::Statement_const*>
                ((SmallVectorBase<slang::ast::Statement_const*> *)&buffer,&local_88);
      SVar2 = ((Statement *)CONCAT44(extraout_var_00,iVar7))->kind;
      stmt_00 = createBlockStatement
                          (comp,&buffer.super_SmallVectorBase<const_slang::ast::Statement_*>,syntax,
                           Sequential);
      (stmt_00->super_Statement).syntax = pSVar9;
      syntax_00._M_ptr =
           (pSVar9->attributes).
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_00._M_extent._M_extent_value =
           (pSVar9->attributes).
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      ctx = stmt_00;
      ASTContext::setAttributes(context,&stmt_00->super_Statement,syntax_00);
      SmallVectorBase<const_slang::ast::Statement_*>::cleanup
                (&buffer.super_SmallVectorBase<const_slang::ast::Statement_*>,(EVP_PKEY_CTX *)ctx);
      stmt_00->blockSymbol = block;
      if (SVar2 != Invalid) {
        return &stmt_00->super_Statement;
      }
    }
    stmt = badStmt(comp,&stmt_00->super_Statement);
  }
  return stmt;
}

Assistant:

const Statement& Statement::bindBlock(const StatementBlockSymbol& block, const SyntaxNode& syntax,
                                      const ASTContext& context, StatementContext& stmtCtx) {
    BlockStatement* result;
    bool anyBad = false;
    auto& comp = context.getCompilation();

    if (syntax.kind == SyntaxKind::SequentialBlockStatement ||
        syntax.kind == SyntaxKind::ParallelBlockStatement) {
        auto& bss = syntax.as<BlockStatementSyntax>();
        auto& bs = BlockStatement::fromSyntax(comp, bss, context, stmtCtx,
                                              /* addInitializers */ true);
        if (bs.bad())
            return bs;

        result = &bs.as<BlockStatement>();
        result->syntax = &bss;
        context.setAttributes(*result, bss.attributes);
    }
    else if (syntax.kind == SyntaxKind::RsCodeBlock) {
        SmallVector<const Statement*> buffer;
        bindScopeInitializers(context, buffer);

        for (auto item : syntax.as<RsCodeBlockSyntax>().items) {
            if (StatementSyntax::isKind(item->kind)) {
                auto& stmt = bind(item->as<StatementSyntax>(), context, stmtCtx,
                                  /* inList */ true);
                buffer.push_back(&stmt);
                anyBad |= stmt.bad();
            }
        }

        result = createBlockStatement(comp, buffer, syntax);
    }
    else {
        SmallVector<const Statement*> buffer;
        bindScopeInitializers(context, buffer);

        const StatementSyntax* ss;
        if (syntax.kind == SyntaxKind::PatternCaseItem)
            ss = syntax.as<PatternCaseItemSyntax>().statement;
        else
            ss = &syntax.as<StatementSyntax>();
        auto& stmt = bind(*ss, context, stmtCtx, /* inList */ false,
                          /* labelHandled */ true);
        buffer.push_back(&stmt);
        anyBad |= stmt.bad();

        result = createBlockStatement(comp, buffer, syntax);
        result->syntax = ss;
        context.setAttributes(*result, ss->attributes);
    }

    result->blockSymbol = &block;
    if (anyBad)
        return badStmt(comp, result);

    return *result;
}